

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O1

BOOL __thiscall
Js::DebugDocument::GetStatementLocation(DebugDocument *this,int32 ibos,StatementLocation *plocation)

{
  int iVar1;
  ScriptContext *pSVar2;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar4;
  code *pcVar5;
  Interval IVar6;
  Interval other;
  Type end;
  bool bVar7;
  bool bVar8;
  int iVar9;
  charcount_t cVar10;
  undefined4 *puVar11;
  StatementLocation *pSVar12;
  FunctionBody *pFVar13;
  uint uVar14;
  ulong uVar15;
  RecyclerRootPtr<Js::FunctionBody> *this_00;
  Interval local_80;
  Interval func1Range;
  StatementLocation local_58;
  Interval local_38;
  Interval func2Range;
  
  if (ibos < 0) {
    return 0;
  }
  pSVar2 = (this->utf8SourceInfo->m_scriptContext).ptr;
  if (pSVar2 == (ScriptContext *)0x0) {
    return 0;
  }
  iVar9 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar9 != '\0') {
    return 0;
  }
  func1Range.begin = 0;
  func1Range.end = 0;
  local_58.bytecodeSpan.begin = 0;
  local_58.bytecodeSpan.end = 0;
  local_58.function = (FunctionBody *)0x0;
  local_58.statement.begin = 0;
  local_58.statement.end = 0;
  pSVar3 = (this->utf8SourceInfo->functionBodyDictionary).ptr;
  if ((pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0) &&
     ((pSVar3->
      super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ).bucketCount != 0)) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar15 = 0;
    do {
      iVar9 = (pSVar3->
              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ).buckets.ptr[uVar15];
      while (iVar9 != -1) {
        pSVar4 = (pSVar3->
                 super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ).entries.ptr;
        iVar1 = pSVar4[iVar9].
                super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>.
                super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                .
                super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                .next;
        pFVar13 = pSVar4[iVar9].
                  super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>.
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                  .value.ptr;
        if (pFVar13 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                      ,0xa2,"(functionBody)","functionBody");
          if (!bVar7) goto LAB_008b77fd;
          *puVar11 = 0;
        }
        cVar10 = ParseableFunctionInfo::StartInDocument(&pFVar13->super_ParseableFunctionInfo);
        iVar9 = iVar1;
        if ((((func1Range == (Interval)0x0) ||
             (uVar14 = (pFVar13->super_ParseableFunctionInfo).m_cbLength + cVar10,
             cVar10 < (uint)ibos && (-1 < (int)uVar14 || -1 < (int)cVar10))) ||
            ((Interval)local_58.function == (Interval)0x0)) ||
           ((((uint)ibos <= cVar10 && ((int)cVar10 < local_58.statement.begin)) ||
            ((uint)ibos < uVar14 && cVar10 <= (uint)ibos)))) {
          FunctionBody::FindClosestStatements
                    (pFVar13,ibos,(StatementLocation *)&func1Range,&local_58);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (pSVar3->
                      super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ).bucketCount);
  }
  if (func1Range == (Interval)0x0 && (Interval)local_58.function == (Interval)0x0) {
    return 0;
  }
  if (func1Range == (Interval)0x0 || (Interval)local_58.function == (Interval)0x0) {
    pSVar12 = (StatementLocation *)&func1Range;
    if (func1Range == (Interval)0x0) {
      pSVar12 = &local_58;
    }
    plocation->bytecodeSpan = pSVar12->bytecodeSpan;
    IVar6 = pSVar12->statement;
    plocation->function = pSVar12->function;
    plocation->statement = IVar6;
    return 1;
  }
  if (func1Range == (Interval)local_58.function) {
LAB_008b7646:
    if (local_58.statement.begin < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x147,
                                  "(candidateMatch1.statement.begin < candidateMatch2.statement.begin)"
                                  ,
                                  "candidateMatch1.statement.begin < candidateMatch2.statement.begin"
                                 );
      if (!bVar7) goto LAB_008b77fd;
      *puVar11 = 0;
    }
    if (ibos < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x148,"(candidateMatch1.statement.begin < ibos)",
                                  "candidateMatch1.statement.begin < ibos");
      if (!bVar7) goto LAB_008b77fd;
      *puVar11 = 0;
    }
    if (local_58.statement.begin < ibos) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x149,"(candidateMatch2.statement.begin >= ibos)",
                                  "candidateMatch2.statement.begin >= ibos");
      if (!bVar7) {
LAB_008b77fd:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
    (plocation->bytecodeSpan).begin = 0;
    (plocation->bytecodeSpan).end = 0;
    plocation->function = (FunctionBody *)func1Range;
    (plocation->statement).begin = 0;
    (plocation->statement).end = 0;
    end = local_58.statement.begin;
    this_00 = &this->functionBody;
    pFVar13 = Memory::RecyclerRootPtr<Js::FunctionBody>::operator->(this_00);
    bVar7 = FunctionBody::HasLineBreak(pFVar13,ibos,end);
    if (local_58.statement.begin != ibos) {
      pFVar13 = Memory::RecyclerRootPtr<Js::FunctionBody>::operator->(this_00);
      bVar8 = FunctionBody::HasLineBreak(pFVar13,0,ibos);
      if (!bVar8 || bVar7) {
        if (ibos < 1) {
          return 1;
        }
        if (bVar7) {
          pFVar13 = Memory::RecyclerRootPtr<Js::FunctionBody>::operator->(this_00);
          bVar7 = FunctionBody::HasLineBreak(pFVar13,0,ibos);
          if (!bVar7) {
            return 1;
          }
        }
      }
    }
    plocation->bytecodeSpan = local_58.bytecodeSpan;
  }
  else {
    local_80.begin = ParseableFunctionInfo::StartInDocument((ParseableFunctionInfo *)func1Range);
    local_80.end = local_80.begin + *(int *)((long)func1Range + 0x5c);
    local_38.begin =
         ParseableFunctionInfo::StartInDocument(&(local_58.function)->super_ParseableFunctionInfo);
    local_38.end = local_38.begin + *(int *)((long)local_58.function + 0x5c);
    IVar6.end = local_38.end;
    IVar6.begin = local_38.begin;
    bVar7 = regex::Interval::Includes(&local_80,IVar6);
    if (((bVar7) && (bVar7 = regex::Interval::Includes(&local_38,ibos), bVar7)) &&
       (local_38.end != ibos)) {
      pSVar12 = &local_58;
    }
    else {
      other.end = local_80.end;
      other.begin = local_80.begin;
      bVar7 = regex::Interval::Includes(&local_38,other);
      if (((!bVar7) || (bVar7 = regex::Interval::Includes(&local_80,ibos), !bVar7)) ||
         (local_80.end == ibos)) goto LAB_008b7646;
      pSVar12 = (StatementLocation *)&func1Range;
    }
    plocation->bytecodeSpan = pSVar12->bytecodeSpan;
    local_58.function._0_4_ = *(Type *)&pSVar12->function;
    local_58.function._4_4_ = *(Type *)((long)&pSVar12->function + 4);
    local_58.statement.begin = (pSVar12->statement).begin;
    local_58.statement.end = (pSVar12->statement).end;
  }
  *(Type *)&plocation->function = (Type)local_58.function;
  *(Type *)((long)&plocation->function + 4) = local_58.function._4_4_;
  (plocation->statement).begin = local_58.statement.begin;
  (plocation->statement).end = local_58.statement.end;
  return 1;
}

Assistant:

BOOL DebugDocument::GetStatementLocation(int32 ibos, StatementLocation* plocation)
    {
        if (ibos < 0)
        {
            return FALSE;
        }

        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return FALSE;
        }

        uint32 ubos = static_cast<uint32>(ibos);

        // Getting the appropriate statement on the asked position works on the heuristic which requires two
        // probable candidates. These candidates will be closest to the ibos where first.range.start < ibos and
        // second.range.start >= ibos. They will be fetched out by going into each FunctionBody.

        StatementLocation candidateMatch1 = {};
        StatementLocation candidateMatch2 = {};

        this->utf8SourceInfo->MapFunction([&](FunctionBody* pFuncBody)
        {
            uint32 functionStart = pFuncBody->StartInDocument();
            uint32 functionEnd = functionStart + pFuncBody->LengthInBytes();

            // For the first candidate, we should allow the current function to participate if its range
            // (instead of just start offset) is closer to the ubos compared to already found candidate1.

            if (candidateMatch1.function == nullptr ||
                ((candidateMatch1.statement.begin <= static_cast<int>(functionStart) ||
                candidateMatch1.statement.end <= static_cast<int>(functionEnd)) &&
                ubos > functionStart) ||
                candidateMatch2.function == nullptr ||
                (candidateMatch2.statement.begin > static_cast<int>(functionStart) &&
                ubos <= functionStart) ||
                (functionStart <= ubos &&
                ubos < functionEnd))
            {
                // We need to find out two possible candidate from the current FunctionBody.
                pFuncBody->FindClosestStatements(ibos, &candidateMatch1, &candidateMatch2);
            }
        });

        if (candidateMatch1.function == nullptr && candidateMatch2.function == nullptr)
        {
            return FALSE; // No Match found
        }

        if (candidateMatch1.function == nullptr || candidateMatch2.function == nullptr)
        {
            *plocation = (candidateMatch1.function == nullptr) ? candidateMatch2 : candidateMatch1;

            return TRUE;
        }

        // If one of the func is inner to another one, and ibos is in the inner one, disregard the outer one/let the inner one win.
        // See WinBlue 575634. Scenario is like this: var foo = function () {this;} -- and BP is set to 'this;' 'function'.
        if (candidateMatch1.function != candidateMatch2.function)
        {
            Assert(candidateMatch1.function && candidateMatch2.function);

            regex::Interval func1Range(candidateMatch1.function->StartInDocument());
            func1Range.End(func1Range.Begin() + candidateMatch1.function->LengthInBytes());
            regex::Interval func2Range(candidateMatch2.function->StartInDocument());
            func2Range.End(func2Range.Begin() + candidateMatch2.function->LengthInBytes());

            // If cursor (ibos) is just after the closing braces of the inner function then we can't
            // directly choose inner function and have to make line break check, so fallback
            // function foo(){function bar(){var y=1;}#var x=1;bar();}foo(); - ibos is #
            if (func1Range.Includes(func2Range) && func2Range.Includes(ibos) && func2Range.End() != ibos)
            {
                *plocation = candidateMatch2;
                return TRUE;
            }
            else if (func2Range.Includes(func1Range) && func1Range.Includes(ibos) && func1Range.End() != ibos)
            {
                *plocation = candidateMatch1;
                return TRUE;
            }
        }

        // At this point we have both candidate to consider.

        Assert(candidateMatch1.statement.begin < candidateMatch2.statement.begin);
        Assert(candidateMatch1.statement.begin < ibos);
        Assert(candidateMatch2.statement.begin >= ibos);

        // Default selection
        *plocation = candidateMatch1;

        // If the second candidate start at ibos or
        // if the first candidate has line break between ibos and the second candidate is on the same line as ibos
        // then consider the second one.

        BOOL fNextHasLineBreak = this->HasLineBreak(ibos, candidateMatch2.statement.begin);

        if ((candidateMatch2.statement.begin == ibos)
            || (this->HasLineBreak(candidateMatch1.statement.begin, ibos) && !fNextHasLineBreak))
        {
            *plocation = candidateMatch2;
        }
        // If ibos is out of the range of first candidate, choose second candidate if  ibos is on the same line as second candidate
        // or ibos is not on the same line of the end of the first candidate.
        else if (candidateMatch1.statement.end < ibos && (!fNextHasLineBreak || this->HasLineBreak(candidateMatch1.statement.end, ibos)))
        {
            *plocation = candidateMatch2;
        }

        return TRUE;
    }